

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O2

int EC_POINT_point2cbb(CBB *out,EC_GROUP *group,EC_POINT *point,point_conversion_form_t form,
                      BN_CTX *ctx)

{
  int iVar1;
  size_t len;
  size_t sVar2;
  uint uVar3;
  uint8_t *p;
  uchar *local_38;
  
  uVar3 = 0;
  len = EC_POINT_point2oct((EC_GROUP *)group,(EC_POINT *)point,form,(uchar *)0x0,0,(BN_CTX *)ctx);
  if (len != 0) {
    iVar1 = CBB_add_space(out,&local_38,len);
    if (iVar1 == 0) {
      uVar3 = 0;
    }
    else {
      sVar2 = EC_POINT_point2oct((EC_GROUP *)group,(EC_POINT *)point,form,local_38,len,(BN_CTX *)ctx
                                );
      uVar3 = (uint)(sVar2 == len);
    }
  }
  return uVar3;
}

Assistant:

int EC_POINT_point2cbb(CBB *out, const EC_GROUP *group, const EC_POINT *point,
                       point_conversion_form_t form, BN_CTX *ctx) {
  size_t len = EC_POINT_point2oct(group, point, form, NULL, 0, ctx);
  if (len == 0) {
    return 0;
  }
  uint8_t *p;
  return CBB_add_space(out, &p, len) &&
         EC_POINT_point2oct(group, point, form, p, len, ctx) == len;
}